

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O2

int gladLoadGL(void)

{
  int iVar1;
  long lVar2;
  
  iVar1 = 0;
  lVar2 = 0;
  do {
    if (lVar2 == 8) {
      return 0;
    }
    libGL = (void *)dlopen((long)&open_gl_NAMES_rel +
                           (long)*(int *)((long)&open_gl_NAMES_rel + lVar2),0x102);
    lVar2 = lVar2 + 4;
  } while (libGL == (void *)0x0);
  gladGetProcAddressPtr = (PFNGLXGETPROCADDRESSPROC_PRIVATE)dlsym(libGL,"glXGetProcAddressARB");
  if ((gladGetProcAddressPtr != (PFNGLXGETPROCADDRESSPROC_PRIVATE)0x0) &&
     (iVar1 = gladLoadGLLoader(get_proc), libGL != (void *)0x0)) {
    dlclose();
    libGL = (void *)0x0;
  }
  return iVar1;
}

Assistant:

int gladLoadGL(void) {
    int status = 0;

    if(open_gl()) {
        status = gladLoadGLLoader(&get_proc);
        close_gl();
    }

    return status;
}